

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextStrFromUtf8(ImWchar *buf,int buf_size,char *in_text,char *in_text_end,
                     char **in_text_remaining)

{
  int iVar1;
  bool bVar2;
  uint local_44;
  ImWchar *pIStack_40;
  uint c;
  ImWchar *buf_end;
  ImWchar *buf_out;
  char **in_text_remaining_local;
  char *in_text_end_local;
  char *in_text_local;
  ImWchar *pIStack_10;
  int buf_size_local;
  ImWchar *buf_local;
  
  pIStack_40 = buf + buf_size;
  buf_end = buf;
  buf_out = (ImWchar *)in_text_remaining;
  in_text_remaining_local = (char **)in_text_end;
  in_text_end_local = in_text;
  in_text_local._4_4_ = buf_size;
  pIStack_10 = buf;
  while( true ) {
    bVar2 = false;
    if ((buf_end < pIStack_40 + -1) &&
       ((in_text_remaining_local == (char **)0x0 ||
        (bVar2 = false, in_text_end_local < in_text_remaining_local)))) {
      bVar2 = *in_text_end_local != '\0';
    }
    if (!bVar2) break;
    iVar1 = ImTextCharFromUtf8(&local_44,in_text_end_local,(char *)in_text_remaining_local);
    in_text_end_local = in_text_end_local + iVar1;
    if (local_44 == 0) break;
    if (local_44 < 0x10000) {
      *buf_end = (ImWchar)local_44;
      buf_end = buf_end + 1;
    }
  }
  *buf_end = 0;
  if (buf_out != (ImWchar *)0x0) {
    *(char **)buf_out = in_text_end_local;
  }
  return (int)((long)buf_end - (long)pIStack_10 >> 1);
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        if (c <= IM_UNICODE_CODEPOINT_MAX)    // FIXME: Losing characters that don't fit in 2 bytes
            *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}